

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

Vec_Ptr_t * Cof_ManCollectHighFanout(Cof_Man_t *p,int nNodes)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  bool bVar2;
  uint local_2c;
  Cof_Obj_t *pCStack_28;
  int i;
  Cof_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Cof_Man_t *p_local;
  
  vNodes_00 = Vec_PtrAlloc(nNodes);
  local_2c = 0;
  do {
    bVar2 = false;
    if ((int)local_2c < p->nObjData) {
      pCStack_28 = Cof_ManObj(p,local_2c);
      bVar2 = pCStack_28 != (Cof_Obj_t *)0x0;
    }
    if (!bVar2) {
      return vNodes_00;
    }
    iVar1 = Cof_ObjIsCi(pCStack_28);
    if (iVar1 == 0) {
      iVar1 = Cof_ObjIsNode(pCStack_28);
      if (iVar1 != 0) goto LAB_008d6652;
    }
    else {
LAB_008d6652:
      Cof_ManInsertEntry_rec(vNodes_00,pCStack_28,nNodes);
    }
    iVar1 = Cof_ObjSize(pCStack_28);
    local_2c = iVar1 + local_2c;
  } while( true );
}

Assistant:

Vec_Ptr_t * Cof_ManCollectHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( nNodes );
    Cof_ManForEachObj( p, pObj, i )
        if ( Cof_ObjIsCi(pObj) || Cof_ObjIsNode(pObj) )
            Cof_ManInsertEntry_rec( vNodes, pObj, nNodes );
    return vNodes;
}